

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

uint32 __thiscall Clasp::SharedContext::problemComplexity(SharedContext *this)

{
  bool bVar1;
  uint32 uVar2;
  size_type sVar3;
  int iVar4;
  Solver *pSVar5;
  reference ppCVar6;
  SharedContext *in_RDI;
  uint32 i;
  uint32 r;
  SharedContext *in_stack_ffffffffffffffd0;
  Constraint *pCVar7;
  size_type local_18;
  uint32 local_14;
  uint32 local_4;
  
  bVar1 = isExtended(in_RDI);
  if (bVar1) {
    local_14 = numBinary((SharedContext *)0x1d61db);
    uVar2 = numTernary((SharedContext *)0x1d61e9);
    local_14 = local_14 + uVar2;
    local_18 = 0;
    while( true ) {
      pSVar5 = master((SharedContext *)0x1d620f);
      sVar3 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
                        (&pSVar5->constraints_);
      if (local_18 == sVar3) break;
      pSVar5 = master((SharedContext *)0x1d6232);
      ppCVar6 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::
                operator[](&pSVar5->constraints_,local_18);
      pCVar7 = *ppCVar6;
      pSVar5 = master((SharedContext *)0x1d6257);
      iVar4 = (*pCVar7->_vptr_Constraint[8])(pCVar7,pSVar5);
      local_14 = iVar4 + local_14;
      local_18 = local_18 + 1;
    }
    local_4 = local_14;
  }
  else {
    local_4 = numConstraints(in_stack_ffffffffffffffd0);
  }
  return local_4;
}

Assistant:

uint32 SharedContext::problemComplexity() const {
	if (isExtended()) {
		uint32 r = numBinary() + numTernary();
		for (uint32 i = 0; i != master()->constraints_.size(); ++i) {
			r += master()->constraints_[i]->estimateComplexity(*master());
		}
		return r;
	}
	return numConstraints();
}